

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogWriter.cpp
# Opt level: O0

ostream * xe::operator<<(ostream *str,Base64Formatter *fmt)

{
  int iVar1;
  deUint8 *pdVar2;
  uint local_3c;
  uint local_38;
  char local_33;
  char local_32;
  char local_31;
  char local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  byte local_2d;
  undefined1 uStack_2c;
  char d [4];
  deUint8 s2;
  deUint8 s1;
  deUint8 s0;
  int numRead;
  int srcNdx;
  int numBytes;
  deUint8 *data;
  Base64Formatter *fmt_local;
  ostream *str_local;
  
  pdVar2 = fmt->data;
  iVar1 = fmt->numBytes;
  stack0xffffffffffffffd8 = 0;
  while (stack0xffffffffffffffd8 < iVar1) {
    _uStack_2c = de::min<int>(3,iVar1 - stack0xffffffffffffffd8);
    local_2d = pdVar2[stack0xffffffffffffffd8];
    if (_uStack_2c < 2) {
      local_38 = 0;
    }
    else {
      local_38 = (uint)pdVar2[stack0xffffffffffffffd8 + 1];
    }
    local_2e = (undefined1)local_38;
    if (_uStack_2c < 3) {
      local_3c = 0;
    }
    else {
      local_3c = (uint)pdVar2[stack0xffffffffffffffd8 + 2];
    }
    local_2f = (undefined1)local_3c;
    register0x00000000 = _uStack_2c + stack0xffffffffffffffd8;
    local_33 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(uint)local_2d >> 2];
    local_32 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)((local_2d & 3) << 4 | (int)local_38 >> 4)];
    local_31 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)((local_38 & 0xf) << 2 | (int)local_3c >> 6)];
    local_30 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(local_3c & 0x3f)];
    if (_uStack_2c < 3) {
      local_30 = '=';
    }
    if (_uStack_2c < 2) {
      local_31 = '=';
    }
    std::ostream::write((char *)str,(long)&local_33);
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Base64Formatter& fmt)
{
	static const char s_base64Table[64] =
	{
		'A','B','C','D','E','F','G','H','I','J','K','L','M',
		'N','O','P','Q','R','S','T','U','V','W','X','Y','Z',
		'a','b','c','d','e','f','g','h','i','j','k','l','m',
		'n','o','p','q','r','s','t','u','v','w','x','y','z',
		'0','1','2','3','4','5','6','7','8','9','+','/'
	};

	const deUint8*	data		= fmt.data;
	int				numBytes	= fmt.numBytes;
	int				srcNdx		= 0;

	DE_ASSERT(data && (numBytes > 0));

	/* Loop all input chars. */
	while (srcNdx < numBytes)
	{
		int		numRead	= de::min(3, numBytes - srcNdx);
		deUint8	s0		= data[srcNdx];
		deUint8	s1		= (numRead >= 2) ? data[srcNdx+1] : 0;
		deUint8	s2		= (numRead >= 3) ? data[srcNdx+2] : 0;
		char	d[4];

		srcNdx += numRead;

		d[0] = s_base64Table[s0 >> 2];
		d[1] = s_base64Table[((s0&0x3)<<4) | (s1>>4)];
		d[2] = s_base64Table[((s1&0xF)<<2) | (s2>>6)];
		d[3] = s_base64Table[s2&0x3F];

		if (numRead < 3) d[3] = '=';
		if (numRead < 2) d[2] = '=';

		/* Write data. */
		str.write(&d[0], sizeof(d));
	}

	return str;
}